

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O3

bool __thiscall cmFileTimeCache::Compare(cmFileTimeCache *this,string *f1,string *f2,int *result)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  cmFileTime ft2;
  cmFileTime ft1;
  cmFileTime local_30;
  cmFileTime local_28;
  
  iVar3 = 0;
  local_28.NS = 0;
  local_30.NS = 0;
  bVar1 = Load(this,f1,&local_28);
  bVar2 = false;
  if (bVar1) {
    bVar1 = Load(this,f2,&local_30);
    iVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      iVar3 = ((local_30.NS <= local_28.NS) - 1) + (uint)(local_30.NS <= local_28.NS);
      if (local_28.NS == local_30.NS) {
        iVar3 = 0;
      }
      bVar2 = true;
    }
  }
  *result = iVar3;
  return bVar2;
}

Assistant:

bool cmFileTimeCache::Compare(std::string const& f1, std::string const& f2,
                              int* result)
{
  // Get the modification time for each file.
  cmFileTime ft1, ft2;
  if (this->Load(f1, ft1) && this->Load(f2, ft2)) {
    // Compare the two modification times.
    *result = ft1.Compare(ft2);
    return true;
  }
  // No comparison available.  Default to the same time.
  *result = 0;
  return false;
}